

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ParamDict *this_00;
  bool bVar3;
  int id;
  int len;
  uint local_30;
  int local_2c;
  
  clear(this);
  local_30 = 0;
  iVar1 = (*dr->_vptr_DataReader[3])(dr,&local_30,4);
  if ((ParamDict *)CONCAT44(extraout_var,iVar1) == (ParamDict *)&DAT_00000004) {
    do {
      this_00 = (ParamDict *)(long)(int)local_30;
      if (this_00 == (ParamDict *)0xffffffffffffff17) {
        return 0;
      }
      if ((int)local_30 < -0x5b03) {
        uVar2 = -local_30 - 0x5b04;
        bVar3 = local_30 < 0xffffa4dd;
        this_00 = (ParamDict *)(ulong)uVar2;
        local_30 = uVar2;
        if (bVar3) {
LAB_00171185:
          load_param_bin(this_00);
          return -1;
        }
        local_2c = 0;
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&local_2c,4);
        if ((ParamDict *)CONCAT44(extraout_var_00,iVar1) != (ParamDict *)&DAT_00000004) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_00,iVar1));
          return -1;
        }
        Mat::create(&this->d->params[(int)local_30].v,local_2c,4,(Allocator *)0x0);
        iVar1 = (*dr->_vptr_DataReader[3])
                          (dr,this->d->params[(int)local_30].v.data,(long)local_2c << 2);
        if ((ParamDict *)CONCAT44(extraout_var_01,iVar1) != (ParamDict *)((long)local_2c * 4)) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_01,iVar1));
          return -1;
        }
        this->d->params[(int)local_30].type = 4;
      }
      else {
        if (0x1f < (int)local_30) goto LAB_00171185;
        iVar1 = (*dr->_vptr_DataReader[3])(dr,&this->d->params[(long)this_00].field_1,4);
        if ((ParamDict *)CONCAT44(extraout_var_02,iVar1) != (ParamDict *)&DAT_00000004) {
          load_param_bin((ParamDict *)CONCAT44(extraout_var_02,iVar1));
          return -1;
        }
        this->d->params[(int)local_30].type = 1;
      }
      iVar1 = (*dr->_vptr_DataReader[3])(dr,&local_30,4);
    } while ((ParamDict *)CONCAT44(extraout_var_03,iVar1) == (ParamDict *)&DAT_00000004);
    load_param_bin((ParamDict *)CONCAT44(extraout_var_03,iVar1));
  }
  else {
    load_param_bin((ParamDict *)CONCAT44(extraout_var,iVar1));
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

    //     binary 0
    //     binary 100
    //     binary 1
    //     binary 1.250000
    //     binary 3 | array_bit
    //     binary 5
    //     binary 0.1
    //     binary 0.2
    //     binary 0.4
    //     binary 0.8
    //     binary 1.0
    //     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

            d->params[id].v.create(len);

            float* ptr = d->params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

            d->params[id].type = 4;
        }
        else
        {
            nread = dr.read(&d->params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

            d->params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }
    }

    return 0;
}